

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

int IDAGetSensDky(void *ida_mem,sunrealtype t,int k,N_Vector *dkySout)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  long lVar3;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar2 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar1 = 0xd59;
  }
  else if (*(int *)((long)ida_mem + 0x9c) == 0) {
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    iVar2 = -0x28;
    error_code = -0x28;
    iVar1 = 0xd62;
  }
  else if (dkySout == (N_Vector *)0x0) {
    msgfmt = "dky = NULL illegal.";
    iVar2 = -0x1b;
    error_code = -0x1b;
    iVar1 = 0xd6a;
  }
  else {
    if ((-1 < k) && (k <= *(int *)((long)ida_mem + 0x4b8))) {
      if (*(int *)((long)ida_mem + 0xa0) < 1) {
        return 0;
      }
      lVar3 = 0;
      do {
        iVar1 = IDAGetSensDky1(ida_mem,t,k,(int)lVar3,dkySout[lVar3]);
        if (iVar1 != 0) {
          return iVar1;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < *(int *)((long)ida_mem + 0xa0));
      return 0;
    }
    msgfmt = "Illegal value for k.";
    iVar2 = -0x19;
    error_code = -0x19;
    iVar1 = 0xd72;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar1,"IDAGetSensDky",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int IDAGetSensDky(void* ida_mem, sunrealtype t, int k, N_Vector* dkySout)
{
  int is, ier = 0;
  IDAMem IDA_mem;

  /* Check all inputs for legality */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  if (IDA_mem->ida_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_SENS);
  }

  if (dkySout == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  if ((k < 0) || (k > IDA_mem->ida_kk))
  {
    IDAProcessError(IDA_mem, IDA_BAD_K, __LINE__, __func__, __FILE__, MSG_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_K);
  }

  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    ier = IDAGetSensDky1(ida_mem, t, k, is, dkySout[is]);
    if (ier != IDA_SUCCESS) { break; }
  }

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (ier);
}